

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

qint64 anon_unknown.dwarf_2db0c8::secondsBetween(tm *start,tm *stop)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  R_conflict4 RVar7;
  int iVar8;
  int a;
  int iVar9;
  
  iVar1 = start->tm_sec;
  iVar2 = start->tm_min;
  iVar3 = start->tm_hour;
  iVar9 = start->tm_mday;
  iVar4 = stop->tm_year;
  for (a = (start->tm_year - iVar4) * 0xc + start->tm_mon; iVar6 = stop->tm_mon, iVar6 < a;
      a = a + -1) {
    RVar7 = QRoundingDown::qDivMod<12U,_int,_true>(a);
    bVar5 = (ulong)RVar7 >> 0x20 == 0;
    iVar6 = RVar7.remainder;
    if (bVar5) {
      iVar6 = 0xc;
    }
    iVar8 = (iVar4 + RVar7.quotient) - (uint)bVar5;
    iVar6 = QGregorianCalendar::monthLength(iVar6,(iVar8 - (uint)(iVar8 < -0x76b)) + 0x76c);
    iVar9 = iVar9 + iVar6;
  }
  for (; a < iVar6; a = a + 1) {
    RVar7 = QRoundingDown::qDivMod<12U,_int,_true>(a);
    iVar6 = iVar4 + RVar7.quotient;
    iVar6 = QGregorianCalendar::monthLength
                      (RVar7.remainder + 1,(iVar6 - (uint)(iVar6 < -0x76b)) + 0x76c);
    iVar9 = iVar9 - iVar6;
    iVar6 = stop->tm_mon;
  }
  return ((long)stop->tm_sec - (long)iVar1) +
         (((long)stop->tm_min - (long)iVar2) +
         (((long)stop->tm_hour - (long)iVar3) + ((long)stop->tm_mday - (long)iVar9) * 0x18) * 0x3c)
         * 0x3c;
}

Assistant:

Q_DECL_COLD_FUNCTION
qint64 secondsBetween(const struct tm &start, const struct tm &stop)
{
    // Nominal difference between start and stop, in seconds (negative if start
    // is after stop); may differ from actual UTC difference if there's a
    // transition between them.
    struct tm from = matchYearMonth(start, stop);
    qint64 diff = stop.tm_mday - from.tm_mday; // in days
    diff = diff * 24 + stop.tm_hour - from.tm_hour; // in hours
    diff = diff * 60 + stop.tm_min - from.tm_min; // in minutes
    return diff * 60 + stop.tm_sec - from.tm_sec; // in seconds
}